

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O0

void __thiscall Simulator::var_real(Simulator *this,PCode *code)

{
  string *name;
  bool local_a9;
  double local_a8;
  Symbol local_a0;
  PCode *local_18;
  PCode *code_local;
  Simulator *this_local;
  
  local_18 = code;
  code_local = (PCode *)this;
  name = PCode::first_abi_cxx11_(code);
  local_a8 = 0.0;
  local_a9 = false;
  Symbol::Symbol(&local_a0,name,&local_a8,&local_a9);
  ScopeTree::define(&this->tree_,&local_a0);
  Symbol::~Symbol(&local_a0);
  inc_eip(this);
  return;
}

Assistant:

void Simulator::var_real(const PCode &code) {
    tree_.define(Symbol(code.first(), 0.0, false));
    inc_eip();
}